

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O2

bool basisu::unpack_bc7_mode0_2(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  color_rgba *pcVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  uint8_t *puVar7;
  byte *pbVar8;
  uint8_t uVar9;
  uint32_t i_1;
  long lVar10;
  color_rgba (*pacVar11) [8];
  uint32_t c;
  ulong uVar12;
  uint32_t i;
  long lVar13;
  ulong uVar14;
  uint32_t bit_offset;
  color_rgba (*local_148) [8];
  ulong local_140;
  uint32_t local_138;
  uint32_t local_134;
  ulong local_130;
  color_rgba *local_128;
  long local_120;
  color_rgba endpoints [6];
  uint32_t pbits [6];
  uint32_t weights [16];
  color_rgba block_colors [3] [8];
  
  pacVar11 = (color_rgba (*) [8])(ulong)mode;
  bit_offset = 0;
  local_128 = pPixels;
  local_134 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,mode + 1);
  local_138 = 1 << ((byte)mode & 0x1f);
  if (local_134 == local_138) {
    local_140 = (ulong)((mode == 0) + 2);
    uVar5 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,(mode != 0) + 4 + (uint)(mode != 0));
    local_130 = CONCAT44(extraout_var,uVar5);
    local_148 = pacVar11;
    for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
      for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 4) {
        uVar6 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,mode == 0 ^ 5);
        puVar7 = color_rgba::operator[]((color_rgba *)((long)&endpoints[0].field_0 + lVar13),uVar5);
        *puVar7 = (uint8_t)uVar6;
        pacVar11 = local_148;
      }
    }
    if ((int)pacVar11 == 0) {
      for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
        uVar5 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,1);
        pbits[lVar13] = uVar5;
      }
    }
    uVar12 = local_130 & 0xffffffff;
    iVar2 = (int)local_140;
    uVar14 = 0;
    do {
      pacVar11 = local_148;
      if (uVar14 == 0) {
LAB_00238564:
        uVar5 = iVar2 - 1;
      }
      else {
        if (uVar14 == 0x10) goto LAB_0023857e;
        if ((uVar14 == (byte)basist::g_bc7_table_anchor_index_third_subset_1[uVar12]) ||
           (uVar5 = (uint32_t)local_140,
           uVar14 == (byte)basist::g_bc7_table_anchor_index_third_subset_2[uVar12]))
        goto LAB_00238564;
      }
      uVar5 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,uVar5);
      weights[uVar14] = uVar5;
      uVar14 = uVar14 + 1;
    } while( true );
  }
LAB_002386f4:
  return local_134 == local_138;
LAB_0023857e:
  if (bit_offset != 0x80) {
    __assert_fail("bit_offset == 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                  ,0x1e2,"bool basisu::unpack_bc7_mode0_2(uint32_t, const void *, color_rgba *)");
  }
  lVar13 = 0;
LAB_00238598:
  if (lVar13 != 6) {
    uVar5 = 0;
    do {
      uVar9 = 0xff;
      if (uVar5 != 3) {
        if (uVar5 == 4) goto LAB_002385f9;
        pbVar8 = color_rgba::operator[](endpoints + lVar13,uVar5);
        if ((int)pacVar11 == 0) {
          uVar6 = bc7_dequant((uint)*pbVar8,pbits[lVar13],4);
          uVar9 = (uint8_t)uVar6;
        }
        else {
          uVar6 = bc7_dequant((uint)*pbVar8,5);
          uVar9 = (uint8_t)uVar6;
        }
      }
      puVar7 = color_rgba::operator[](endpoints + lVar13,uVar5);
      *puVar7 = uVar9;
      uVar5 = uVar5 + 1;
    } while( true );
  }
  for (local_120 = 0; local_120 != 3; local_120 = local_120 + 1) {
    lVar13 = local_120 * 2;
    lVar3 = local_120 * 2;
    local_148 = block_colors + local_120;
    for (lVar10 = 0; (uint32_t)lVar10 >> ((byte)local_140 & 0x1f) == 0; lVar10 = lVar10 + 1) {
      pcVar4 = *local_148;
      for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
        pbVar8 = color_rgba::operator[](endpoints + lVar13,uVar5);
        bVar1 = *pbVar8;
        pbVar8 = color_rgba::operator[](endpoints + lVar3 + 1,uVar5);
        uVar6 = bc7_interp((uint)bVar1,(uint)*pbVar8,(uint32_t)lVar10,(uint32_t)local_140);
        puVar7 = color_rgba::operator[](pcVar4 + lVar10,uVar5);
        *puVar7 = (uint8_t)uVar6;
      }
      (*local_148)[lVar10].field_0.m_comps[3] = 0xff;
    }
  }
  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    local_128[lVar13].field_0 =
         block_colors[(byte)basist::g_bc7_partition3[lVar13 + (ulong)(uint)((int)local_130 << 4)]]
         [weights[lVar13]].field_0;
  }
  goto LAB_002386f4;
LAB_002385f9:
  lVar13 = lVar13 + 1;
  goto LAB_00238598;
}

Assistant:

bool unpack_bc7_mode0_2(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
	{
		//const uint32_t SUBSETS = 3;
		const uint32_t ENDPOINTS = 6;
		const uint32_t COMPS = 3;
		const uint32_t WEIGHT_BITS = (mode == 0) ? 3 : 2;
		const uint32_t ENDPOINT_BITS = (mode == 0) ? 4 : 5;
		const uint32_t PBITS = (mode == 0) ? 6 : 0;
		const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
		uint32_t bit_offset = 0;
		const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

		if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

		const uint32_t part = read_bits32(pBuf, bit_offset, (mode == 0) ? 4 : 6);

		color_rgba endpoints[ENDPOINTS];
		for (uint32_t c = 0; c < COMPS; c++)
			for (uint32_t e = 0; e < ENDPOINTS; e++)
				endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);

		uint32_t pbits[6];
		for (uint32_t p = 0; p < PBITS; p++)
			pbits[p] = read_bits32(pBuf, bit_offset, 1);

		uint32_t weights[16];
		for (uint32_t i = 0; i < 16; i++)
			weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == basist::g_bc7_table_anchor_index_third_subset_1[part]) || (i == basist::g_bc7_table_anchor_index_third_subset_2[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);

		assert(bit_offset == 128);

		for (uint32_t e = 0; e < ENDPOINTS; e++)
			for (uint32_t c = 0; c < 4; c++)
				endpoints[e][c] = (uint8_t)((c == 3) ? 255 : (PBITS ? bc7_dequant(endpoints[e][c], pbits[e], ENDPOINT_BITS) : bc7_dequant(endpoints[e][c], ENDPOINT_BITS)));

		color_rgba block_colors[3][8];
		for (uint32_t s = 0; s < 3; s++)
			for (uint32_t i = 0; i < WEIGHT_VALS; i++)
			{
				for (uint32_t c = 0; c < 3; c++)
					block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
				block_colors[s][i][3] = 255;
			}

		for (uint32_t i = 0; i < 16; i++)
			pPixels[i] = block_colors[basist::g_bc7_partition3[part * 16 + i]][weights[i]];

		return true;
	}